

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digit.hpp
# Opt level: O0

void Qentem::Digit::realToString<double,Qentem::StringStream<char>,unsigned_long_long>
               (StringStream<char> *stream,unsigned_long_long number,RealFormatInfo format)

{
  SizeT32 SVar1;
  uint uVar2;
  uint calculated_digits;
  SizeT started_at;
  ulong uVar3;
  SizeT64 SVar4;
  bool bVar5;
  bool bVar6;
  bool is_positive_exp_00;
  uint local_12c;
  SizeT32 local_128;
  uint local_124;
  SizeT32 size;
  SizeT start_at;
  SizeT32 max_index;
  SizeT32 times;
  SizeT32 needed;
  SizeT32 shift;
  SizeT32 m_shift;
  SizeT32 drop;
  uint uStack_f8;
  bool round_up;
  bool no_fraction;
  bool big_offset;
  bool extra_digits;
  bool fixed;
  SizeT32 fraction_length;
  SizeT32 digits;
  SizeT32 exp_actual_value;
  SizeT32 first_bit;
  SizeT32 positive_exp;
  bool is_positive_exp;
  int exponent;
  SizeT32 first_shift;
  BigIntSys b_int;
  unsigned_long_long mantissa;
  unsigned_long_long bias;
  SizeT32 number_size;
  unsigned_long_long number_local;
  StringStream<char> *stream_local;
  RealFormatInfo format_local;
  
  uVar3 = number & 0x7ff0000000000000;
  if (uVar3 == 0x7ff0000000000000) {
    if ((number & 0xfffffffffffff) == 0) {
      if ((number & 0x8000000000000000) != 0) {
        StringStream<char>::operator+=(stream,'-');
      }
      StringStream<char>::Write(stream,"inf",3);
    }
    else {
      StringStream<char>::Write(stream,"nan",3);
    }
  }
  else {
    if ((number & 0x8000000000000000) != 0) {
      StringStream<char>::operator+=(stream,'-');
    }
    b_int._152_8_ = number & 0xfffffffffffff;
    stream_local._4_1_ = format.Type;
    stream_local._0_4_ = format.Precision;
    if ((b_int._152_8_ == 0) && (uVar3 == 0)) {
      StringStream<char>::operator+=(stream,'0');
      if (stream_local._4_1_ == Fixed) {
        StringStream<char>::operator+=(stream,'.');
        insertZerosLarge<Qentem::StringStream<char>>(stream,(uint)stream_local);
      }
    }
    else {
      if (uVar3 == 0) {
        b_int._152_8_ = b_int._152_8_ << 1;
      }
      else {
        b_int._152_8_ = b_int._152_8_ | 0x10000000000000;
      }
      BigInt<unsigned_long_long,_1216U>::BigInt<unsigned_long_long>
                ((BigInt<unsigned_long_long,_1216U> *)&exponent,b_int._152_8_);
      SVar1 = Platform::FindFirstBit<unsigned_long_long>(b_int._152_8_);
      local_124 = (uint)(uVar3 >> 0x34) - 0x3ff;
      is_positive_exp_00 = -1 < (int)local_124;
      if (!is_positive_exp_00) {
        local_124 = -local_124;
      }
      uVar2 = 0x34 - SVar1;
      calculated_digits = ((local_124 + (uVar3 == 0) * uVar2) * 0x7597) / 100000 + 1;
      uStack_f8 = 0;
      bVar5 = stream_local._4_1_ != SemiFixed;
      bVar6 = stream_local._4_1_ != Fixed;
      if (is_positive_exp_00 &&
          (uVar2 <= local_124 || (uint)stream_local < calculated_digits && (bVar5 && bVar6))) {
        if ((uint)stream_local < calculated_digits && (bVar5 && bVar6)) {
          local_128 = calculated_digits - ((uint)stream_local + 1);
        }
        else {
          local_128 = 0;
        }
        uVar2 = local_128 + 0x34;
        if (uVar2 < local_124) {
          BigInt<unsigned_long_long,_1216U>::operator<<=
                    ((BigInt<unsigned_long_long,_1216U> *)&exponent,local_124 - uVar2);
        }
        else {
          BigInt<unsigned_long_long,_1216U>::operator>>=
                    ((BigInt<unsigned_long_long,_1216U> *)&exponent,uVar2 - local_124);
        }
        m_shift._3_1_ = local_128 != 0;
        if (m_shift._3_1_) {
          bigIntDropDigits<Qentem::BigInt<unsigned_long_long,1216u>>
                    ((BigInt<unsigned_long_long,_1216U> *)&exponent,local_128);
        }
      }
      else {
        times = 0;
        if (is_positive_exp_00) {
          local_124 = -local_124;
          if (bVar5 && bVar6) {
            max_index = (uint)stream_local - calculated_digits;
          }
          else {
            max_index = (uint)stream_local;
          }
        }
        else {
          max_index = calculated_digits + (uint)stream_local;
        }
        uStack_f8 = uVar2 + local_124;
        uVar2 = max_index + 1;
        m_shift._3_1_ = uVar2 < uStack_f8;
        if (m_shift._3_1_) {
          times = uStack_f8 - uVar2;
          uStack_f8 = uVar2;
        }
        BigInt<unsigned_long_long,_1216U>::operator>>=
                  ((BigInt<unsigned_long_long,_1216U> *)&exponent,SVar1);
        start_at = uStack_f8;
        if (0x1a < uStack_f8) {
          if ((uint)stream_local < 300) {
            local_12c = (uint)stream_local / 0x13 + 2;
          }
          else {
            local_12c = BigInt<unsigned_long_long,_1216U>::MaxIndex();
          }
          do {
            SVar4 = DigitUtils::DigitConst<8U>::GetPowerOfFive(0x1b);
            BigInt<unsigned_long_long,_1216U>::operator*=
                      ((BigInt<unsigned_long_long,_1216U> *)&exponent,SVar4);
            SVar1 = BigInt<unsigned_long_long,_1216U>::Index
                              ((BigInt<unsigned_long_long,_1216U> *)&exponent);
            if ((local_12c <= SVar1) && (0x3f < times)) {
              BigInt<unsigned_long_long,_1216U>::operator>>=
                        ((BigInt<unsigned_long_long,_1216U> *)&exponent,0x40);
              times = times - 0x40;
            }
            start_at = start_at - 0x1b;
          } while (0x1a < start_at);
        }
        if (start_at != 0) {
          SVar4 = DigitUtils::DigitConst<8U>::GetPowerOfFive(start_at);
          BigInt<unsigned_long_long,_1216U>::operator*=
                    ((BigInt<unsigned_long_long,_1216U> *)&exponent,SVar4);
        }
        BigInt<unsigned_long_long,_1216U>::operator>>=
                  ((BigInt<unsigned_long_long,_1216U> *)&exponent,times);
      }
      started_at = StringStream<char>::Length(stream);
      bigIntToString<Qentem::StringStream<char>,Qentem::BigInt<unsigned_long_long,1216u>>
                (stream,(BigInt<unsigned_long_long,_1216U> *)&exponent);
      if (stream_local._4_1_ == Fixed) {
        formatStringNumberFixed<true,Qentem::StringStream<char>>
                  (stream,started_at,(uint)stream_local,calculated_digits,uStack_f8,m_shift._3_1_);
      }
      else if (stream_local._4_1_ == SemiFixed) {
        formatStringNumberFixed<false,Qentem::StringStream<char>>
                  (stream,started_at,(uint)stream_local,calculated_digits,uStack_f8,m_shift._3_1_);
      }
      else {
        formatStringNumberDefault<Qentem::StringStream<char>>
                  (stream,started_at,(uint)stream_local,calculated_digits,uStack_f8,
                   is_positive_exp_00,m_shift._3_1_);
      }
    }
  }
  return;
}

Assistant:

static void realToString(Stream_T &stream, const Number_T number, const RealFormatInfo format) {
        constexpr SizeT32 number_size = sizeof(Number_T);

        using Info_T = DigitUtils::RealNumberInfo<Float_T, number_size>;
        // 4.9406564584124654e-324 needs about 1216 bits to store all its digits.
        using BigIntSys  = BigInt<SystemIntType, ((Info_T::Bias + 1U) + (number_size * 8U * 3U))>;
        using DigitConst = DigitUtils::DigitConst<BigIntSys::SizeOfType()>;

        const Number_T bias = (number & Info_T::ExponentMask);

        if (bias != Info_T::ExponentMask) {
            if ((number & Info_T::SignMask) != 0) {
                stream += DigitUtils::DigitChar::Negative;
            }

            Number_T mantissa = (number & Info_T::MantissaMask);

            if ((mantissa != 0) || (bias != 0)) {
                if (bias != 0) {
                    mantissa |= Info_T::LeadingBit;
                } else {
                    mantissa <<= 1U;
                }

                BigIntSys b_int{mantissa};
                /////////////////////////////////////
                const SizeT32 first_shift      = Platform::FindFirstBit(mantissa);
                const int     exponent         = (int)((bias >> Info_T::MantissaSize) - Info_T::Bias);
                const bool    is_positive_exp  = (exponent >= 0);
                const SizeT32 positive_exp     = SizeT32(is_positive_exp ? exponent : -exponent);
                const SizeT32 first_bit        = (Info_T::MantissaSize - first_shift);
                const SizeT32 exp_actual_value = (positive_exp + ((bias == 0) * first_bit));
                const SizeT32 digits           = (((exp_actual_value * 30103U) / 100000) + 1U);
                SizeT32       fraction_length  = 0;
                const bool    fixed =
                    ((format.Type == RealFormatType::SemiFixed) | (format.Type == RealFormatType::Fixed));
                const bool extra_digits = ((digits > format.Precision) & !fixed);
                const bool big_offset   = (positive_exp >= first_bit);
                const bool no_fraction  = (is_positive_exp & (big_offset | extra_digits));
                bool       round_up     = false;
                /////////////////////////////////////
                if (no_fraction) {
                    const SizeT32 drop    = ((!extra_digits) ? 0 : (digits - (format.Precision + 1U)));
                    const SizeT32 m_shift = (Info_T::MantissaSize + drop);

                    if (m_shift < positive_exp) {
                        b_int <<= (positive_exp - m_shift);
                    } else {
                        b_int >>= (m_shift - positive_exp);
                    }

                    if (drop != 0) {
                        round_up = true;
                        bigIntDropDigits(b_int, drop);
                    }
                } else {
                    SizeT32 shift   = 0;
                    SizeT32 needed  = 0;
                    fraction_length = first_bit;

                    if (is_positive_exp) {
                        fraction_length -= positive_exp;

                        if (fixed) {
                            needed = format.Precision;
                        } else {
                            needed = (format.Precision - digits);
                        }
                    } else {
                        fraction_length += positive_exp;
                        needed = (digits + format.Precision);
                    }

                    ++needed; // For rounding.

                    if (fraction_length > needed) {
                        shift           = (fraction_length - needed);
                        fraction_length = needed;
                        round_up        = true;
                    }

                    b_int >>= first_shift;

                    SizeT32 times = fraction_length;

                    if (times >= DigitConst::MaxPowerOfFive) {
                        const SizeT32 max_index = (format.Precision < Info_T::MaxCut)
                                                      ? ((format.Precision / DigitConst::MaxPowerOfTen) + 2U)
                                                      : b_int.MaxIndex();

                        do {
                            b_int *= DigitConst::GetPowerOfFive(DigitConst::MaxPowerOfFive);

                            if ((b_int.Index() >= max_index) && (shift >= DigitConst::MaxShift)) {
                                b_int >>= DigitConst::MaxShift;
                                shift -= DigitConst::MaxShift;
                            }

                            times -= DigitConst::MaxPowerOfFive;
                        } while (times >= DigitConst::MaxPowerOfFive);
                    }

                    if (times != 0) {
                        b_int *= DigitConst::GetPowerOfFive(times);
                    }

                    b_int >>= shift;
                }

                const SizeT start_at = stream.Length();
                bigIntToString(stream, b_int);

                switch (format.Type) {
                    case RealFormatType::SemiFixed: {
                        formatStringNumberFixed<false>(stream, start_at, format.Precision, digits, fraction_length,
                                                       round_up);
                        break;
                    }

                    case RealFormatType::Fixed: {
                        formatStringNumberFixed<true>(stream, start_at, format.Precision, digits, fraction_length,
                                                      round_up);
                        break;
                    }

                    default: {
                        formatStringNumberDefault(stream, start_at, format.Precision, digits, fraction_length,
                                                  is_positive_exp, round_up);
                    }
                }

            } else {
                stream += DigitUtils::DigitChar::Zero;

                if (format.Type == RealFormatType::Fixed) {
                    stream += DigitUtils::DigitChar::Dot;
                    insertZerosLarge(stream, format.Precision);
                }
            }
        } else {
            using Char_T           = typename Stream_T::CharType;
            constexpr SizeT32 size = sizeof(Char_T);
            using DigitString      = DigitUtils::DigitString<Char_T, size>;

            if ((number & Info_T::MantissaMask) == 0) {
                if ((number & Info_T::SignMask) != 0) {
                    stream += DigitUtils::DigitChar::Negative;
                }

                stream.Write(DigitString::Infinity, DigitString::InfinityLength);
            } else {
                stream.Write(DigitString::NotANumber, DigitString::NotANumberLength);
            }
        }
    }